

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O0

void __thiscall chrono::ChFrameMoving<double>::Invert(ChFrameMoving<double> *this)

{
  double *this_00;
  ChQuaternion<double> local_280;
  ChVector<double> local_250;
  undefined1 local_238 [8];
  ChFrameMoving<double> unit;
  ChVector<double> local_120;
  undefined1 local_108 [8];
  ChFrameMoving<double> tmp;
  ChFrameMoving<double> *this_local;
  
  tmp.coord_dtdt.rot.m_data[3] = (double)this;
  ChVector<double>::ChVector(&local_120,0.0,0.0,0.0);
  this_00 = unit.coord_dtdt.rot.m_data + 3;
  ChQuaternion<double>::ChQuaternion((ChQuaternion<double> *)this_00,1.0,0.0,0.0,0.0);
  ChFrameMoving((ChFrameMoving<double> *)local_108,&local_120,(ChQuaternion<double> *)this_00);
  ChVector<double>::ChVector(&local_250,0.0,0.0,0.0);
  ChQuaternion<double>::ChQuaternion(&local_280,1.0,0.0,0.0,0.0);
  ChFrameMoving((ChFrameMoving<double> *)local_238,&local_250,&local_280);
  operator=((ChFrameMoving<double> *)local_108,this);
  TransformParentToLocal((ChFrameMoving<double> *)local_108,(ChFrameMoving<double> *)local_238,this)
  ;
  ~ChFrameMoving((ChFrameMoving<double> *)local_238);
  ~ChFrameMoving((ChFrameMoving<double> *)local_108);
  return;
}

Assistant:

virtual void Invert() override {
        ChFrameMoving<Real> tmp;
        ChFrameMoving<Real> unit;
        tmp = *this;
        tmp.TransformParentToLocal(unit, *this);
    }